

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finder.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
::line_start_finder(line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
                    *this,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char_class_type cVar1;
  int j;
  long lVar2;
  
  (this->
  super_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super_counted_base<boost::xpressive::detail::finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .count_.value_ = 0;
  (this->
  super_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._vptr_finder = (_func_int **)&PTR__finder_00188bb0;
  cVar1 = lookup_classname<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,8ul>
                    (tr,(char (*) [8])"newline",false);
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    (&(this->
      super_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).field_0xc)[lVar2] =
         ((tr->super_cpp_regex_traits<char>).super_cpp_regex_traits_base<char,_1UL>.masks_[lVar2] &
         cVar1) != 0;
  }
  return;
}

Assistant:

line_start_finder(Traits const &tr)
    {
        char_class_type newline = lookup_classname(tr, "newline");
        for(int j = 0; j < 256; ++j)
        {
            this->bits_[j] = tr.isctype(static_cast<char_type>(static_cast<unsigned char>(j)), newline);
        }
    }